

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_setup(mbedtls_md_context_t *ctx,mbedtls_md_info_t *md_info,int hmac)

{
  void *pvVar1;
  int hmac_local;
  mbedtls_md_info_t *md_info_local;
  mbedtls_md_context_t *ctx_local;
  
  if ((md_info == (mbedtls_md_info_t *)0x0) || (ctx == (mbedtls_md_context_t *)0x0)) {
    ctx_local._4_4_ = -0x5100;
  }
  else {
    pvVar1 = (*md_info->ctx_alloc_func)();
    ctx->md_ctx = pvVar1;
    if (pvVar1 == (void *)0x0) {
      ctx_local._4_4_ = -0x5180;
    }
    else {
      if (hmac != 0) {
        pvVar1 = calloc(2,(long)md_info->block_size);
        ctx->hmac_ctx = pvVar1;
        if (ctx->hmac_ctx == (void *)0x0) {
          (*md_info->ctx_free_func)(ctx->md_ctx);
          return -0x5180;
        }
      }
      ctx->md_info = md_info;
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_md_setup( mbedtls_md_context_t *ctx, const mbedtls_md_info_t *md_info, int hmac )
{
    if( md_info == NULL || ctx == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( ( ctx->md_ctx = md_info->ctx_alloc_func() ) == NULL )
        return( MBEDTLS_ERR_MD_ALLOC_FAILED );

    if( hmac != 0 )
    {
        ctx->hmac_ctx = mbedtls_calloc( 2, md_info->block_size );
        if( ctx->hmac_ctx == NULL )
        {
            md_info->ctx_free_func( ctx->md_ctx );
            return( MBEDTLS_ERR_MD_ALLOC_FAILED );
        }
    }

    ctx->md_info = md_info;

    return( 0 );
}